

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O0

VkImageMemoryBarrier * __thiscall
myvk::ImageBase::GetMemoryBarrier
          (ImageBase *this,VkImageAspectFlags aspect_mask,VkAccessFlags src_access_mask,
          VkAccessFlags dst_access_mask,VkImageLayout old_layout,VkImageLayout new_layout,
          uint32_t src_queue_family,uint32_t dst_queue_family)

{
  VkAccessFlags in_ECX;
  VkImageAspectFlags in_EDX;
  ImageBase *in_RSI;
  VkImageMemoryBarrier *in_RDI;
  VkAccessFlags in_R8D;
  VkImageLayout in_R9D;
  VkImageMemoryBarrier *ret;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  VkImageSubresourceRange local_2c;
  VkImageLayout local_18;
  VkAccessFlags local_14;
  VkAccessFlags local_10;
  VkImageAspectFlags local_c;
  
  local_18 = in_R9D;
  local_14 = in_R8D;
  local_10 = in_ECX;
  local_c = in_EDX;
  memset(in_RDI,0,0x48);
  in_RDI->sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  in_RDI->image = in_RSI->m_image;
  in_RDI->oldLayout = local_18;
  in_RDI->newLayout = (VkImageLayout)ret;
  in_RDI->srcAccessMask = local_10;
  in_RDI->dstAccessMask = local_14;
  in_RDI->srcQueueFamilyIndex = in_stack_00000010;
  in_RDI->dstQueueFamilyIndex = in_stack_00000018;
  GetSubresourceRange(&local_2c,in_RSI,local_c);
  (in_RDI->subresourceRange).aspectMask = local_2c.aspectMask;
  (in_RDI->subresourceRange).baseMipLevel = local_2c.baseMipLevel;
  (in_RDI->subresourceRange).levelCount = local_2c.levelCount;
  (in_RDI->subresourceRange).baseArrayLayer = local_2c.baseArrayLayer;
  (in_RDI->subresourceRange).layerCount = local_2c.layerCount;
  return in_RDI;
}

Assistant:

VkImageMemoryBarrier ImageBase::GetMemoryBarrier(VkImageAspectFlags aspect_mask, VkAccessFlags src_access_mask,
                                                 VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                                 VkImageLayout new_layout, uint32_t src_queue_family,
                                                 uint32_t dst_queue_family) const {
	VkImageMemoryBarrier ret = {};
	ret.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
	ret.image = m_image;
	ret.oldLayout = old_layout;
	ret.newLayout = new_layout;
	ret.srcAccessMask = src_access_mask;
	ret.dstAccessMask = dst_access_mask;
	ret.srcQueueFamilyIndex = src_queue_family;
	ret.dstQueueFamilyIndex = dst_queue_family;
	ret.subresourceRange = GetSubresourceRange(aspect_mask);
	return ret;
}